

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_sum.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  mbedtls_md_type_t md_type;
  byte bVar2;
  uchar uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  mbedtls_md_type_t *pmVar7;
  mbedtls_md_info_t *pmVar8;
  char *pcVar9;
  FILE *__stream;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  char cVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  mbedtls_md_context_t md_ctx;
  uchar sum [64];
  char line [1024];
  mbedtls_md_context_t local_520;
  byte local_508 [64];
  byte local_4c8 [142];
  char acStack_43a [68];
  undefined1 local_3f6 [966];
  
  mbedtls_md_init(&local_520);
  if (argc == 1) {
    puts("print mode:  generic_sum <mbedtls_md> <file> <file> ...");
    puts("check mode:  generic_sum <mbedtls_md> -c <checksum file>");
    puts("\nAvailable message digests:");
    pmVar7 = (mbedtls_md_type_t *)mbedtls_md_list();
    md_type = *pmVar7;
    while (md_type != MBEDTLS_MD_NONE) {
      pmVar7 = pmVar7 + 1;
      pmVar8 = mbedtls_md_info_from_type(md_type);
      pcVar9 = mbedtls_md_get_name(pmVar8);
      printf("  %s\n",pcVar9);
      md_type = *pmVar7;
    }
    return 1;
  }
  pmVar8 = mbedtls_md_info_from_string(argv[1]);
  if (pmVar8 == (mbedtls_md_info_t *)0x0) {
    main_cold_2();
    return 1;
  }
  iVar5 = mbedtls_md_setup(&local_520,pmVar8,0);
  if (iVar5 != 0) {
    main_cold_1();
    return 1;
  }
  if (argc == 4) {
    pbVar15 = (byte *)argv[2];
    uVar6 = *pbVar15 - 0x2d;
    if ((uVar6 == 0) && (uVar6 = pbVar15[1] - 99, uVar6 == 0)) {
      uVar6 = (uint)pbVar15[2];
    }
    if (uVar6 == 0) {
      pcVar9 = argv[3];
      __stream = fopen(pcVar9,"rb");
      if (__stream != (FILE *)0x0) {
        memset(acStack_43a + 2,0,0x400);
        pcVar9 = fgets(acStack_43a + 2,0x3ff,__stream);
        if (pcVar9 != (char *)0x0) {
          pcVar9 = acStack_43a + 2;
          uVar16 = 0;
          uVar6 = 0;
          uVar1 = 0;
          uVar17 = 0;
LAB_0010340e:
          do {
            sVar10 = strlen(pcVar9);
            bVar2 = mbedtls_md_get_size(pmVar8);
            if (((sVar10 < (ulong)bVar2 * 2 + 4) ||
                (bVar2 = mbedtls_md_get_size(pmVar8), acStack_43a[(ulong)bVar2 * 2 + 2] != ' ')) ||
               (bVar2 = mbedtls_md_get_size(pmVar8), acStack_43a[(ulong)bVar2 * 2 + 3] != ' ')) {
              pcVar11 = mbedtls_md_get_name(pmVar8);
              printf("No \'%s\' hash found on line.\n",pcVar11);
              iVar5 = (int)sVar10 + -1;
            }
            else {
              cVar13 = acStack_43a[sVar10 + 1];
              sVar12 = sVar10 - 1;
              if (cVar13 == '\n') {
                acStack_43a[sVar10 + 1] = '\0';
                cVar13 = acStack_43a[sVar10];
                sVar12 = sVar10 - 2;
                sVar10 = sVar10 - 1;
              }
              if (cVar13 == '\r') {
                acStack_43a[sVar12 + 2] = '\0';
                sVar10 = sVar12;
              }
              uVar6 = uVar6 + 1;
              bVar2 = mbedtls_md_get_size(pmVar8);
              iVar5 = generic_wrapper(pmVar8,acStack_43a + (ulong)bVar2 * 2 + 4,local_508);
              if (iVar5 != 0) goto LAB_001035d8;
              uVar3 = mbedtls_md_get_size(pmVar8);
              if (uVar3 != '\0') {
                pbVar15 = local_4c8;
                uVar14 = 0;
                do {
                  sprintf((char *)pbVar15,"%02x",(ulong)local_508[uVar14]);
                  uVar14 = uVar14 + 1;
                  bVar2 = mbedtls_md_get_size(pmVar8);
                  pbVar15 = pbVar15 + 2;
                } while (uVar14 < bVar2);
              }
              uVar3 = mbedtls_md_get_size(pmVar8);
              if (uVar3 != '\0') {
                uVar14 = 0;
                bVar2 = 0;
                do {
                  bVar2 = bVar2 | local_4c8[uVar14] ^ acStack_43a[uVar14 + 2];
                  uVar14 = uVar14 + 1;
                  bVar4 = mbedtls_md_get_size(pmVar8);
                } while (uVar14 < (uint)bVar4 * 2);
                if (bVar2 != 0) {
                  uVar1 = uVar1 + 1;
                  fprintf(_stderr,"wrong checksum: %s\n",local_3f6);
                }
              }
              uVar16 = (ulong)((int)uVar16 + 1);
              iVar5 = 0x3ff;
            }
            pcVar11 = fgets(pcVar9,iVar5,__stream);
            if (pcVar11 == (char *)0x0) {
              if ((int)uVar17 != 0) goto LAB_001036ca;
              goto LAB_001036dc;
            }
          } while( true );
        }
        goto LAB_001036f4;
      }
      printf("failed to open: %s\n",pcVar9);
      goto LAB_0010370f;
    }
  }
  else {
    uVar6 = 0;
    if (argc < 3) goto LAB_00103715;
  }
  uVar17 = 2;
  bVar2 = 0;
  do {
    pcVar9 = argv[uVar17];
    iVar5 = generic_wrapper(pmVar8,pcVar9,(uchar *)(acStack_43a + 2));
    bVar4 = 1;
    if (iVar5 == 0) {
      uVar3 = mbedtls_md_get_size(pmVar8);
      if (uVar3 != '\0') {
        uVar16 = 0;
        do {
          printf("%02x",(ulong)(byte)acStack_43a[uVar16 + 2]);
          uVar16 = uVar16 + 1;
          bVar4 = mbedtls_md_get_size(pmVar8);
        } while (uVar16 < bVar4);
      }
      bVar4 = 0;
      printf("  %s\n",pcVar9);
    }
    bVar2 = bVar2 | bVar4;
    uVar17 = uVar17 + 1;
  } while (uVar17 != (uint)argc);
  uVar6 = (uint)bVar2;
  goto LAB_00103715;
LAB_001035d8:
  pcVar11 = fgets(pcVar9,(int)sVar10 + -1,__stream);
  uVar17 = (ulong)((int)uVar17 + 1);
  if (pcVar11 == (char *)0x0) goto LAB_001036ca;
  goto LAB_0010340e;
LAB_001036ca:
  printf("WARNING: %d (out of %d) input files could not be read\n",uVar17,(ulong)uVar6);
LAB_001036dc:
  if (uVar1 != 0) {
    printf("WARNING: %d (out of %d) computed checksums did not match\n",(ulong)uVar1,uVar16);
  }
LAB_001036f4:
  fclose(__stream);
LAB_0010370f:
  uVar6 = 1;
LAB_00103715:
  mbedtls_md_free(&local_520);
  return uVar6;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    mbedtls_md_init( &md_ctx );

    if( argc == 1 )
    {
        const int *list;

        mbedtls_printf( "print mode:  generic_sum <mbedtls_md> <file> <file> ...\n" );
        mbedtls_printf( "check mode:  generic_sum <mbedtls_md> -c <checksum file>\n" );

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        return( exit_code );
    }

    /*
     * Read the MD from the command line
     */
    md_info = mbedtls_md_info_from_string( argv[1] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[1] );
        return( exit_code );
    }
    if( mbedtls_md_setup( &md_ctx, md_info, 0 ) )
    {
        mbedtls_fprintf( stderr, "Failed to initialize context.\n" );
        return( exit_code );
    }

    ret = 0;
    if( argc == 4 && strcmp( "-c", argv[2] ) == 0 )
    {
        ret |= generic_check( md_info, argv[3] );
        goto exit;
    }

    for( i = 2; i < argc; i++ )
        ret |= generic_print( md_info, argv[i] );

    if ( ret == 0 )
        exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    mbedtls_md_free( &md_ctx );

    return( exit_code );
}